

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void __thiscall
embree::MetalMaterial::MetalMaterial
          (MetalMaterial *this,Vec3fa *reflectance,Vec3fa *eta,Vec3fa *k,float roughness)

{
  undefined8 uVar1;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  SceneGraph::Node::Node((Node *)this,&local_50);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002cd800;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002cd1b0;
  (this->base).type = 2;
  uVar1 = *(undefined8 *)((long)&reflectance->field_0 + 8);
  *(undefined8 *)&(this->reflectance).field_0 = *(undefined8 *)&reflectance->field_0;
  *(undefined8 *)((long)&(this->reflectance).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&eta->field_0 + 8);
  *(undefined8 *)&(this->eta).field_0 = *(undefined8 *)&eta->field_0;
  *(undefined8 *)((long)&(this->eta).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&k->field_0 + 8);
  *(undefined8 *)&(this->k).field_0 = *(undefined8 *)&k->field_0;
  *(undefined8 *)((long)&(this->k).field_0 + 8) = uVar1;
  this->roughness = roughness;
  return;
}

Assistant:

MetalMaterial (const Vec3fa& reflectance, const Vec3fa& eta, const Vec3fa& k, const float roughness)
      : base(MATERIAL_METAL), reflectance(reflectance), eta(eta), k(k), roughness(roughness) {}